

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O2

void __thiscall covenant::DFA<covenant::Sym>::complement(DFA<covenant::Sym> *this)

{
  uint uVar1;
  reference rVar2;
  
  for (uVar1 = 0;
      (ulong)uVar1 <
      (ulong)(this->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(this->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8; uVar1 = uVar1 + 1)
  {
    rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->accepts,(ulong)uVar1);
    *rVar2._M_p = *rVar2._M_p ^ rVar2._M_mask;
  }
  return;
}

Assistant:

void complement()
    {
      for(unsigned int i=0; i < this->accepts.size(); i++)
      {
        this->accepts[i].flip(); 
      }
    }